

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O2

void __thiscall
agge::tests::mocks::mask<8ul>::
mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,2>
          (mask<8ul> *this,
          pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*cells) [2],
          int y0)

{
  int iVar1;
  long lVar2;
  cell *pcVar3;
  int i;
  long lVar4;
  int iVar5;
  value_type *__x;
  int iVar6;
  bool bVar7;
  
  *(int *)(this + 4) = y0;
  *(undefined4 *)(this + 8) = 2;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  iVar6 = 0x7fffffff;
  iVar5 = -0x7fffffff;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    __x = *cells + lVar4;
    std::
    vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
    ::push_back((vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                 *)(this + 0x10),__x);
    pcVar3 = __x->first;
    lVar2 = ((long)__x->second - (long)pcVar3) / 0xc;
    while (bVar7 = lVar2 != 0, lVar2 = lVar2 + -1, bVar7) {
      iVar5 = pcVar3->x;
      if (iVar5 <= iVar6) {
        iVar6 = iVar5;
      }
      pcVar3 = pcVar3 + 1;
    }
  }
  iVar1 = -1;
  if (-1 < iVar5 - iVar6) {
    iVar1 = iVar5 - iVar6;
  }
  *(int *)this = iVar1 + 1;
  return;
}

Assistant:

mask(const T (&cells)[n], int y0)
					: _min_y(y0), _height(n)
				{
					int min_x = 0x7FFFFFFF, max_x = -0x7FFFFFFF;

					for (int i = 0; i != n; ++i)
					{
						_cells.push_back(cells[i]);
						for (int j = 0; j != cells[i].second - cells[i].first; ++j)
						{
							min_x = agge_min(min_x, (cells[i].first + j)->x);
							max_x = agge_max(min_x, (cells[i].first + j)->x);
						}
					}
					_width = agge_max(max_x - min_x, -1) + 1;
				}